

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackTraceGnu-inl.cpp
# Opt level: O2

BackTraceSymbol * __thiscall
cppassert::internal::BackTraceSymbol::operator=(BackTraceSymbol *this,BackTraceSymbol *other)

{
  char *pcVar1;
  
  deallocate(this);
  pcVar1 = other->allocated_;
  this->symbol_ = other->symbol_;
  this->allocated_ = pcVar1;
  other->symbol_ = (char *)0x0;
  other->allocated_ = (char *)0x0;
  return this;
}

Assistant:

BackTraceSymbol &operator=(BackTraceSymbol &&other)
    {
        deallocate();
        allocated_ = other.allocated_;
        symbol_ = other.symbol_;
        other.allocated_ = nullptr;
        other.symbol_ = nullptr;
        return (*this);
    }